

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CellConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CellConfigRuleSyntax,slang::parsing::Token,slang::syntax::ConfigCellIdentifierSyntax&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConfigCellIdentifierSyntax *args_1,
          ConfigRuleClauseSyntax *args_2,Token *args_3)

{
  Token semi;
  CellConfigRuleSyntax *ruleClause;
  undefined8 in_RCX;
  Info *in_RDX;
  Token *in_RSI;
  undefined8 *in_R8;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  ruleClause = (CellConfigRuleSyntax *)
               allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  semi.info = in_RDX;
  semi.kind = (short)in_RCX;
  semi._2_1_ = (char)((ulong)in_RCX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  semi.rawLen = (int)((ulong)in_RCX >> 0x20);
  slang::syntax::CellConfigRuleSyntax::CellConfigRuleSyntax
            ((CellConfigRuleSyntax *)in_R8[1],*in_RSI,(ConfigCellIdentifierSyntax *)*in_R8,
             (ConfigRuleClauseSyntax *)ruleClause,semi);
  return ruleClause;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }